

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

VkDescriptorBufferInfo * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::addUniformData
          (VkDescriptorBufferInfo *__return_storage_ptr__,UniformBlockCaseInstance *this,
          deUint32 size,void *dataPtr)

{
  deInt32 *pdVar1;
  VkDescriptorBufferInfo *pVVar2;
  VkDevice device;
  DeviceInterface *vkd;
  Allocation *pAVar3;
  ulong bufferSize;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  SharedPtr<vk::Allocation> local_78;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_68;
  Move<vk::Handle<(vk::HandleType)8>_> local_58;
  VkDescriptorBufferInfo *local_38;
  
  local_38 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  bufferSize = (ulong)size;
  createBuffer(&local_58,(this->super_TestInstance).m_context,bufferSize,0x10);
  allocateAndBindMemory
            (&local_68,(this->super_TestInstance).m_context,
             (VkBuffer)
             local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  memcpy((local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
         ->m_hostPtr,dataPtr,bufferSize);
  ::vk::flushMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             ((local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
              .ptr)->m_memory).m_internal,
             (local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
             ptr)->m_offset,bufferSize);
  pVVar2 = local_38;
  (local_38->buffer).m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_38->offset = 0;
  local_38->range = bufferSize;
  pAVar3 = (Allocation *)operator_new(0x20);
  pAVar3->m_offset =
       (VkDeviceSize)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pAVar3->m_hostPtr =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pAVar3->_vptr_Allocation =
       (_func_int **)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  (pAVar3->m_memory).m_internal =
       (deUint64)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
  ;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pAVar3;
  local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_78.m_state)->strongRefCount = 0;
  (local_78.m_state)->weakRefCount = 0;
  (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d53460;
  local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pAVar3;
  (local_78.m_state)->strongRefCount = 1;
  (local_78.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
              *)&this->m_uniformBuffers,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_78);
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Allocation *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pAVar3 = local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
  ;
  local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pAVar3;
  local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_78.m_state)->strongRefCount = 0;
  (local_78.m_state)->weakRefCount = 0;
  (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d552c8;
  local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pAVar3;
  (local_78.m_state)->strongRefCount = 1;
  (local_78.m_state)->weakRefCount = 1;
  std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
  emplace_back<de::SharedPtr<vk::Allocation>>
            ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>> *)
             &this->m_uniformAllocs,&local_78);
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Allocation *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return pVVar2;
}

Assistant:

vk::VkDescriptorBufferInfo UniformBlockCaseInstance::addUniformData (deUint32 size, const void* dataPtr)
{
	const VkDevice					vkDevice			= m_context.getDevice();
	const DeviceInterface&			vk					= m_context.getDeviceInterface();

	Move<VkBuffer>					buffer	= createBuffer(m_context, size, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
	de::MovePtr<Allocation>			alloc	= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	const VkDescriptorBufferInfo			descriptor			=
	{
		*buffer,				// VkBuffer		buffer;
		0u,						// VkDeviceSize	offset;
		size,					// VkDeviceSize	range;

	};

	m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
	m_uniformAllocs.push_back(AllocationSp(alloc.release()));

	return descriptor;
}